

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-inl.h
# Opt level: O3

ExceptionOr<capnp::Capability::Client> * __thiscall
kj::_::ExceptionOr<capnp::Capability::Client>::operator=
          (ExceptionOr<capnp::Capability::Client> *this,
          ExceptionOr<capnp::Capability::Client> *param_1)

{
  ClientHook *pCVar1;
  Disposer *pDVar2;
  
  ExceptionOrValue::operator=(&this->super_ExceptionOrValue,&param_1->super_ExceptionOrValue);
  if (param_1 != this) {
    if ((this->value).ptr.isSet == true) {
      (this->value).ptr.isSet = false;
      pCVar1 = (this->value).ptr.field_1.value.hook.ptr;
      if (pCVar1 != (ClientHook *)0x0) {
        (this->value).ptr.field_1.value.hook.ptr = (ClientHook *)0x0;
        pDVar2 = (this->value).ptr.field_1.value.hook.disposer;
        (**pDVar2->_vptr_Disposer)
                  (pDVar2,(_func_int *)
                          ((long)&pCVar1->_vptr_ClientHook + (long)pCVar1->_vptr_ClientHook[-2]));
      }
    }
    if ((param_1->value).ptr.isSet == true) {
      pCVar1 = (param_1->value).ptr.field_1.value.hook.ptr;
      (this->value).ptr.field_1.value.hook.disposer =
           (param_1->value).ptr.field_1.value.hook.disposer;
      (this->value).ptr.field_1.value.hook.ptr = pCVar1;
      (param_1->value).ptr.field_1.value.hook.ptr = (ClientHook *)0x0;
      (this->value).ptr.isSet = true;
    }
  }
  if ((param_1->value).ptr.isSet == true) {
    (param_1->value).ptr.isSet = false;
    pCVar1 = (param_1->value).ptr.field_1.value.hook.ptr;
    if (pCVar1 != (ClientHook *)0x0) {
      (param_1->value).ptr.field_1.value.hook.ptr = (ClientHook *)0x0;
      pDVar2 = (param_1->value).ptr.field_1.value.hook.disposer;
      (**pDVar2->_vptr_Disposer)
                (pDVar2,(_func_int *)
                        ((long)&pCVar1->_vptr_ClientHook + (long)pCVar1->_vptr_ClientHook[-2]));
    }
  }
  return this;
}

Assistant:

ExceptionOr& operator=(ExceptionOr&&) = default;